

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.h
# Opt level: O1

void __thiscall Controller::CallAction(Controller *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  Tools *pTVar5;
  NewChangeForFile *this_00;
  NewChangeDot *this_01;
  ulong uVar6;
  undefined8 uVar7;
  void *unaff_R14;
  NewCommit newCommit;
  allocator<char> local_e9;
  string local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  string local_68;
  long *local_48 [2];
  long local_38 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_48,
             (((this->
               super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._command)->_M_dataplus)._M_p,(allocator<char> *)&local_e8);
  iVar4 = (**(this->
             super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._vptr_ControllerBase)(this,local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if ((char)iVar4 == '\0') {
    return;
  }
  pvVar1 = (this->
           super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._operations;
  pbVar2 = (pvVar1->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar1->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar2) {
    iVar4 = std::__cxx11::string::compare((char *)pbVar2);
    if (iVar4 == 0) {
      Initialize::Initialize((Initialize *)&local_e8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
        return;
      }
    }
    else {
      pvVar1 = (this->
               super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               )._operations;
      pbVar2 = (pvVar1->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(pvVar1->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
      if (uVar6 < 2) {
        uVar7 = 1;
        goto LAB_0010463e;
      }
      iVar4 = std::__cxx11::string::compare((char *)(pbVar2 + 1));
      if (iVar4 == 0) {
        pTVar5 = Tools::getInstance();
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,".stn","");
        bVar3 = Tools::SearchFileFromDir(pTVar5,&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) {
          return;
        }
        pTVar5 = Tools::getInstance();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_88._M_local_buf,
                   (((this->
                     super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )._arg)->_M_dataplus)._M_p,&local_e9);
        Tools::CheckLine(&local_e8,pTVar5,(string *)&local_88);
        iVar4 = std::__cxx11::string::compare((char *)&local_e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_allocated_capacity != &local_78) {
          operator_delete((void *)local_88._M_allocated_capacity,local_78._M_allocated_capacity + 1)
          ;
        }
        if (iVar4 == 0) {
          this_01 = (NewChangeDot *)operator_new(0x58);
          NewChangeDot::NewChangeDot(this_01);
          (**(this_01->
             super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._vptr_NewChangeBase)(this_01);
          (*(this_01->
            super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            )._vptr_NewChangeBase[1])(this_01);
          return;
        }
        this_00 = (NewChangeForFile *)operator_new(0x78);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_a8._M_local_buf,
                   (((this->
                     super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )._arg)->_M_dataplus)._M_p,(allocator<char> *)&local_e8);
        NewChangeForFile::NewChangeForFile(this_00,(string *)&local_a8);
        (**(this_00->
           super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._vptr_NewChangeBase)(this_00);
        (*(this_00->
          super_NewChangeBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          )._vptr_NewChangeBase[1])(this_00);
        local_e8.field_2._M_allocated_capacity = local_98._M_allocated_capacity;
        local_e8._M_dataplus._M_p = (pointer)local_a8._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_allocated_capacity == &local_98) {
          return;
        }
      }
      else {
        pvVar1 = (this->
                 super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 )._operations;
        pbVar2 = (pvVar1->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar6 = (long)(pvVar1->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
        if (uVar6 < 3) {
          uVar7 = 2;
          goto LAB_0010463e;
        }
        iVar4 = std::__cxx11::string::compare((char *)(pbVar2 + 2));
        if (iVar4 != 0) {
          return;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_c8._M_local_buf,
                   (((this->
                     super_ControllerBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     )._arg)->_M_dataplus)._M_p,&local_e9);
        NewCommit::NewCommit((NewCommit *)&local_e8,(string *)&local_c8);
        local_e8.field_2._M_allocated_capacity = local_b8._M_allocated_capacity;
        local_e8._M_dataplus._M_p = (pointer)local_c8._M_allocated_capacity;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_allocated_capacity == &local_b8) {
          return;
        }
      }
    }
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    return;
  }
  uVar7 = 0;
  uVar6 = 0;
LAB_0010463e:
  uVar7 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar7,uVar6);
  operator_delete(unaff_R14,0x58);
  _Unwind_Resume(uVar7);
}

Assistant:

virtual void CallAction() override {
        if (this->FindOperation(this->_command->data())) {
            if (this->_command->data() == this->_operations->at(0)) {
                Initialize init;
            } else if (this->_command->data() == this->_operations->at(1)) {
                if (Tools::getInstance()->SearchFileFromDir(".stn")) {
                    NewChangeBuilder *newChange = new NewChangeBuilder();
                    if (Tools::getInstance()->CheckLine(this->_arg->data()) == "dot") {
                        newChange->Build(new NewChangeDot());
                    } else {
                        newChange->Build(new NewChangeForFile(this->_arg->data()));
                    }
                }
            } else if (this->_command->data() == this->_operations->at(2)) {
                NewCommit newCommit(this->_arg->data());
            }
        }
    }